

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall mjs::print_visitor::operator()(print_visitor *this,with_statement *s)

{
  expression *e;
  statement *s_00;
  with_statement *s_local;
  print_visitor *this_local;
  
  std::operator<<(this->os_,"with (");
  e = with_statement::e(s);
  accept<mjs::print_visitor>(e,this);
  std::operator<<(this->os_,") ");
  s_00 = with_statement::s(s);
  accept<mjs::print_visitor>(s_00,this);
  return;
}

Assistant:

void operator()(const with_statement& s) {
        os_ << "with (";
        accept(s.e(), *this);
        os_ << ") ";
        accept(s.s(), *this);
    }